

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O0

void __thiscall Quad::Quad(Quad *this,Quad *quadToCopy)

{
  int iVar1;
  Vec2d **ppVVar2;
  Colour *pCVar3;
  Vec2d *this_00;
  int local_24;
  int i;
  Vec2d **verticesToCopy;
  Quad *quadToCopy_local;
  Quad *this_local;
  
  this->vertexCount = 0;
  this->vertices = (Vec2d **)0x0;
  this->fillColour = (Colour *)0x0;
  this->lineColour = (Colour *)0x0;
  ppVVar2 = (Vec2d **)operator_new__(0x20);
  this->vertices = ppVVar2;
  iVar1 = getVertexCount(quadToCopy);
  this->vertexCount = iVar1;
  pCVar3 = getFillColour(quadToCopy);
  this->fillColour = pCVar3;
  pCVar3 = getLineColour(quadToCopy);
  this->lineColour = pCVar3;
  ppVVar2 = getVertices(quadToCopy);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    this_00 = (Vec2d *)operator_new(8);
    Vec2d::Vec2d(this_00,ppVVar2[local_24]);
    this->vertices[local_24] = this_00;
  }
  return;
}

Assistant:

Quad::Quad(Quad* quadToCopy)    {
    vertices = new Vec2d*[4];
    
    vertexCount = quadToCopy->getVertexCount();
    fillColour = quadToCopy->getFillColour();
    lineColour = quadToCopy->getLineColour();
    Vec2d** verticesToCopy = quadToCopy->getVertices();
    for (int i = 0; i < 4; i++) {
        vertices[i] = new Vec2d(verticesToCopy[i]);
    }
    verticesToCopy = nullptr;
}